

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool ON_DimStyle::Internal_EqualOverrideParentFields(ON_DimStyle *a,ON_DimStyle *b)

{
  int iVar1;
  
  iVar1 = memcmp(&a->m_field_override_parent_count,&b->m_field_override_parent_count,0x14);
  return iVar1 == 0;
}

Assistant:

bool ON_DimStyle::Internal_EqualOverrideParentFields(
    const ON_DimStyle& a,
    const ON_DimStyle& b
  )
{
  return (
    a.m_field_override_parent_count == b.m_field_override_parent_count
    && a.m_field_override_parent_bits0 == b.m_field_override_parent_bits0
    && a.m_field_override_parent_bits1 == b.m_field_override_parent_bits1
    && a.m_field_override_parent_bits2 == b.m_field_override_parent_bits2
    && a.m_field_override_parent_bits3 == b.m_field_override_parent_bits3
    );
}